

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError FillInDevInfo(PaAlsaHostApiRepresentation *alsaApi,HwDevInfo *deviceHwInfo,int blocking,
                     PaAlsaDeviceInfo *devInfo,int *devIdx)

{
  char *__s1;
  int iVar1;
  uint uVar2;
  int iVar3;
  PaAlsaDeviceInfo *devInfo_00;
  snd_pcm_t *pcm;
  snd_pcm_t *local_38;
  PaDeviceInfo **ppPVar4;
  
  local_38 = (snd_pcm_t *)0x0;
  (devInfo->baseDeviceInfo).structVersion = -1;
  (devInfo->baseDeviceInfo).name = (char *)0x0;
  (devInfo->baseDeviceInfo).hostApi = -1;
  (devInfo->baseDeviceInfo).maxInputChannels = 0;
  (devInfo->baseDeviceInfo).maxOutputChannels = 0;
  *(undefined4 *)&(devInfo->baseDeviceInfo).defaultLowInputLatency = 0;
  *(undefined4 *)((long)&(devInfo->baseDeviceInfo).defaultLowInputLatency + 4) = 0xbff00000;
  *(undefined4 *)&(devInfo->baseDeviceInfo).defaultLowOutputLatency = 0;
  *(undefined4 *)((long)&(devInfo->baseDeviceInfo).defaultLowOutputLatency + 4) = 0xbff00000;
  *(undefined4 *)&(devInfo->baseDeviceInfo).defaultHighInputLatency = 0;
  *(undefined4 *)((long)&(devInfo->baseDeviceInfo).defaultHighInputLatency + 4) = 0xbff00000;
  *(undefined4 *)&(devInfo->baseDeviceInfo).defaultHighOutputLatency = 0;
  *(undefined4 *)((long)&(devInfo->baseDeviceInfo).defaultHighOutputLatency + 4) = 0xbff00000;
  (devInfo->baseDeviceInfo).defaultSampleRate = -1.0;
  devInfo_00 = (PaAlsaDeviceInfo *)devIdx;
  if ((deviceHwInfo->hasCapture != 0) &&
     (iVar1 = snd_pcm_open(&local_38,deviceHwInfo->alsaName,1,blocking), -1 < iVar1)) {
    uVar2 = GropeDevice(local_38,deviceHwInfo->isPlug,StreamDirection_In,(int)devInfo,devInfo_00);
    ppPVar4 = (PaDeviceInfo **)(ulong)uVar2;
    if (uVar2 != 0) goto LAB_0010b866;
  }
  if ((deviceHwInfo->hasPlayback != 0) &&
     (iVar1 = snd_pcm_open(&local_38,deviceHwInfo->alsaName,0,blocking), -1 < iVar1)) {
    uVar2 = GropeDevice(local_38,deviceHwInfo->isPlug,StreamDirection_Out,(int)devInfo,devInfo_00);
    ppPVar4 = (PaDeviceInfo **)(ulong)uVar2;
    if (uVar2 != 0) goto LAB_0010b866;
  }
  (devInfo->baseDeviceInfo).structVersion = 2;
  (devInfo->baseDeviceInfo).hostApi = alsaApi->hostApiIndex;
  (devInfo->baseDeviceInfo).name = deviceHwInfo->name;
  __s1 = deviceHwInfo->alsaName;
  devInfo->alsaName = __s1;
  ppPVar4 = (PaDeviceInfo **)(ulong)(uint)deviceHwInfo->isPlug;
  devInfo->isPlug = deviceHwInfo->isPlug;
  iVar1 = (devInfo->baseDeviceInfo).maxInputChannels;
  if (iVar1 < 1) {
    if ((devInfo->baseDeviceInfo).maxOutputChannels < 1) goto LAB_0010b866;
    if ((alsaApi->baseHostApiRep).info.defaultInputDevice != -1) goto LAB_0010b80f;
  }
  else {
    if ((alsaApi->baseHostApiRep).info.defaultInputDevice != -1) {
LAB_0010b80f:
      iVar3 = strcmp(__s1,"default");
      if ((iVar1 < 1) || (iVar3 != 0)) goto LAB_0010b82c;
    }
    (alsaApi->baseHostApiRep).info.defaultInputDevice = *devIdx;
  }
LAB_0010b82c:
  if ((alsaApi->baseHostApiRep).info.defaultOutputDevice == -1) {
    iVar1 = *devIdx;
LAB_0010b84c:
    if (0 < (devInfo->baseDeviceInfo).maxOutputChannels) {
      (alsaApi->baseHostApiRep).info.defaultOutputDevice = iVar1;
    }
  }
  else {
    iVar3 = strcmp(__s1,"default");
    iVar1 = *devIdx;
    if (iVar3 == 0) goto LAB_0010b84c;
  }
  ppPVar4 = (alsaApi->baseHostApiRep).deviceInfos;
  ppPVar4[iVar1] = &devInfo->baseDeviceInfo;
  *devIdx = iVar1 + 1;
LAB_0010b866:
  return (PaError)ppPVar4;
}

Assistant:

static PaError FillInDevInfo( PaAlsaHostApiRepresentation *alsaApi, HwDevInfo* deviceHwInfo, int blocking,
        PaAlsaDeviceInfo* devInfo, int* devIdx )
{
    PaError result = 0;
    PaDeviceInfo *baseDeviceInfo = &devInfo->baseDeviceInfo;
    snd_pcm_t *pcm = NULL;
    PaUtilHostApiRepresentation *baseApi = &alsaApi->baseHostApiRep;

    PA_DEBUG(( "%s: Filling device info for: %s\n", __FUNCTION__, deviceHwInfo->name ));

    /* Zero fields */
    InitializeDeviceInfo( baseDeviceInfo );

    /* To determine device capabilities, we must open the device and query the
     * hardware parameter configuration space */

    /* Query capture */
    if( deviceHwInfo->hasCapture &&
        OpenPcm( &pcm, deviceHwInfo->alsaName, SND_PCM_STREAM_CAPTURE, blocking, 0 ) >= 0 )
    {
        if( GropeDevice( pcm, deviceHwInfo->isPlug, StreamDirection_In, blocking, devInfo ) != paNoError )
        {
            /* Error */
            PA_DEBUG(( "%s: Failed groping %s for capture\n", __FUNCTION__, deviceHwInfo->alsaName ));
            goto end;
        }
    }

    /* Query playback */
    if( deviceHwInfo->hasPlayback &&
        OpenPcm( &pcm, deviceHwInfo->alsaName, SND_PCM_STREAM_PLAYBACK, blocking, 0 ) >= 0 )
    {
        if( GropeDevice( pcm, deviceHwInfo->isPlug, StreamDirection_Out, blocking, devInfo ) != paNoError )
        {
            /* Error */
            PA_DEBUG(( "%s: Failed groping %s for playback\n", __FUNCTION__, deviceHwInfo->alsaName ));
            goto end;
        }
    }

    baseDeviceInfo->structVersion = 2;
    baseDeviceInfo->hostApi = alsaApi->hostApiIndex;
    baseDeviceInfo->name = deviceHwInfo->name;
    devInfo->alsaName = deviceHwInfo->alsaName;
    devInfo->isPlug = deviceHwInfo->isPlug;

    /* A: Storing pointer to PaAlsaDeviceInfo object as pointer to PaDeviceInfo object.
     * Should now be safe to add device info, unless the device supports neither capture nor playback
     */
    if( baseDeviceInfo->maxInputChannels > 0 || baseDeviceInfo->maxOutputChannels > 0 )
    {
        /* Make device default if there isn't already one or it is the ALSA "default" device */
        if( ( baseApi->info.defaultInputDevice == paNoDevice ||
            !strcmp( deviceHwInfo->alsaName, "default" ) ) && baseDeviceInfo->maxInputChannels > 0 )
        {
            baseApi->info.defaultInputDevice = *devIdx;
            PA_DEBUG(( "Default input device: %s\n", deviceHwInfo->name ));
        }
        if( ( baseApi->info.defaultOutputDevice == paNoDevice ||
            !strcmp( deviceHwInfo->alsaName, "default" ) ) && baseDeviceInfo->maxOutputChannels > 0 )
        {
            baseApi->info.defaultOutputDevice = *devIdx;
            PA_DEBUG(( "Default output device: %s\n", deviceHwInfo->name ));
        }
        PA_DEBUG(( "%s: Adding device %s: %d\n", __FUNCTION__, deviceHwInfo->name, *devIdx ));
        baseApi->deviceInfos[*devIdx] = (PaDeviceInfo *) devInfo;
        (*devIdx) += 1;
    }
    else
    {
        PA_DEBUG(( "%s: Skipped device: %s, all channels == 0\n", __FUNCTION__, deviceHwInfo->name ));
    }

end:
    return result;
}